

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O0

int __thiscall Fl_Text_Display::find_x(Fl_Text_Display *this,char *s,int len,int style,int x)

{
  int iVar1;
  double dVar2;
  int w;
  int cl;
  int i;
  int x_local;
  int style_local;
  int len_local;
  char *s_local;
  Fl_Text_Display *this_local;
  
  w = 0;
  while( true ) {
    if (len <= w) {
      return len;
    }
    iVar1 = fl_utf8len1(s[w]);
    dVar2 = string_width(this,s,w + iVar1,style);
    if (x < (int)dVar2) break;
    w = iVar1 + w;
  }
  return w;
}

Assistant:

int Fl_Text_Display::find_x(const char *s, int len, int style, int x) const {
  IS_UTF8_ALIGNED(s)

  // TODO: use binary search which may be quicker.
  int i = 0;
  while (i<len) {
    int cl = fl_utf8len1(s[i]);
    int w = int( string_width(s, i+cl, style) );
    if (w>x)
      return i;
    i += cl;
  }
  return len;
}